

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepReInit(void *arkode_mem,ARKRhsFn fse,ARKRhsFn fsi,realtype t0,N_Vector y0)

{
  int iVar1;
  long in_RCX;
  SUNNonlinearSolver_Ops in_RDX;
  void *in_RSI;
  int retval;
  SUNNonlinearSolver NLS;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  N_Vector in_stack_ffffffffffffffb8;
  SUNNonlinearSolver in_stack_ffffffffffffffc0;
  ARKodeMem in_stack_ffffffffffffffc8;
  uint local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(ARKodeMRIStepMem *)0xeb83b9);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffc8->MallocDone == 0) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x17,"ARKode::MRIStep","MRIStepReInit",
                      "Attempt to call before ARKodeInit.");
      local_4 = 0xffffffe9;
    }
    else if ((in_RSI == (void *)0x0) && (in_RDX == (SUNNonlinearSolver_Ops)0x0)) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x16,"ARKode::MRIStep","MRIStepReInit",
                      "Must specify at least one of fe, fi (both NULL).");
      local_4 = 0xffffffea;
    }
    else if (in_RCX == 0) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x16,"ARKode::MRIStep","MRIStepReInit",
                      "y0 = NULL illegal.");
      local_4 = 0xffffffea;
    }
    else {
      *(uint *)&in_stack_ffffffffffffffc0[1].content = (uint)(in_RSI != (void *)0x0);
      *(uint *)((long)&in_stack_ffffffffffffffc0[1].content + 4) =
           (uint)(in_RDX != (SUNNonlinearSolver_Ops)0x0);
      if ((*(int *)((long)&in_stack_ffffffffffffffc0[1].content + 4) != 0) &&
         (in_stack_ffffffffffffffc0[6].content == (void *)0x0)) {
        in_stack_ffffffffffffffb8 =
             (N_Vector)
             SUNNonlinSol_Newton(in_stack_ffffffffffffffb8,
                                 (SUNContext)(ulong)in_stack_ffffffffffffffb0);
        if (in_stack_ffffffffffffffb8 == (N_Vector)0x0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x14,"ARKode::MRIStep","MRIStepReInit",
                          "Error creating default Newton solver");
          MRIStepFree(&in_stack_ffffffffffffffc0->content);
          return -0x14;
        }
        iVar1 = MRIStepSetNonlinearSolver(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        if (iVar1 != 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x14,"ARKode::MRIStep","MRIStepReInit",
                          "Error attaching default Newton solver");
          MRIStepFree(&in_stack_ffffffffffffffc0->content);
          return -0x14;
        }
        *(undefined4 *)&in_stack_ffffffffffffffc0[6].ops = 1;
      }
      local_4 = arkInit(in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb8,0);
      if (local_4 == 0) {
        in_stack_ffffffffffffffc0->content = in_RSI;
        in_stack_ffffffffffffffc0->ops = in_RDX;
        in_stack_ffffffffffffffc0[0xf].content = (void *)0x0;
        in_stack_ffffffffffffffc0[0xf].ops = (SUNNonlinearSolver_Ops)0x0;
        in_stack_ffffffffffffffc0[0xf].sunctx = (SUNContext)0x0;
        in_stack_ffffffffffffffc0[0xb].content = (void *)0x0;
        in_stack_ffffffffffffffc0[0x10].content = (void *)0x0;
        local_4 = 0;
      }
      else {
        arkProcessError(in_stack_ffffffffffffffc8,(int)(ulong)local_4,"ARKode::MRIStep",
                        "MRIStepReInit","Unable to reinitialize main ARKode infrastructure");
      }
    }
  }
  return local_4;
}

Assistant:

int MRIStepReInit(void* arkode_mem, ARKRhsFn fse, ARKRhsFn fsi, realtype t0,
                  N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepReInit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check that at least one of fse, fsi is supplied and is to be used */
  if (fse == NULL && fsi == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NULL_F);
    return(ARK_ILL_INPUT);
  }

  /* Check that y0 is supplied */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepReInit", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit_rhs = (fse == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit_rhs = (fsi == NULL) ? SUNFALSE : SUNTRUE;

  /* Create a default Newton NLS object (just in case; will be deleted if
     the user attaches a nonlinear solver) */
  if (step_mem->implicit_rhs && !(step_mem->NLS)) {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (!NLS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepReInit", "Error creating default Newton solver");
      MRIStepFree((void**) &ark_mem); return(ARK_MEM_FAIL);
    }
    retval = MRIStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepReInit", "Error attaching default Newton solver");
      MRIStepFree((void**) &ark_mem);  return(ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* ReInitialize main ARKode infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepReInit",
                    "Unable to reinitialize main ARKode infrastructure");
    return(retval);
  }

  /* Copy the input parameters into ARKode state */
  step_mem->fse = fse;
  step_mem->fsi = fsi;

  /* Initialize all the counters */
  step_mem->nfse      = 0;
  step_mem->nfsi      = 0;
  step_mem->nsetups   = 0;
  step_mem->nstlp     = 0;
  step_mem->nls_iters = 0;

  return(ARK_SUCCESS);
}